

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestPipe::~TestPipe(TestPipe *this)

{
  ~TestPipe(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~TestPipe() {}